

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O1

Vec_Vec_t *
Ssw_ManFindDirectImplications2(Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fVerbose)

{
  int *piVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  Vec_Vec_t *p_00;
  void **ppvVar4;
  Aig_Man_t *p_01;
  Cnf_Dat_t *p_02;
  sat_solver *s;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  uVar6 = (ulong)(uint)nProps;
  if (nFrames != 1) {
    __assert_fail("nFrames == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigUnfold2.c"
                  ,0xce,"Vec_Vec_t *Ssw_ManFindDirectImplications2(Aig_Man_t *, int, int, int, int)"
                 );
  }
  p_00 = (Vec_Vec_t *)malloc(0x10);
  p_00->nCap = 8;
  p_00->nSize = 0;
  ppvVar4 = (void **)malloc(0x40);
  p_00->pArray = ppvVar4;
  p_01 = Saig_ManUnrollCOI(p,1);
  if (p_01->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(pFrames) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigUnfold2.c"
                  ,0xd3,"Vec_Vec_t *Ssw_ManFindDirectImplications2(Aig_Man_t *, int, int, int, int)"
                 );
  }
  p_02 = Cnf_DeriveSimple(p_01,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_02,1,0);
  if (s != (sat_solver *)0x0) {
    Aig_ManIncrementTravId(p);
    pVVar5 = p->vObjs;
    if (0 < pVVar5->nSize) {
      lVar10 = 0;
      do {
        piVar1 = (int *)pVVar5->pArray[lVar10];
        if ((((piVar1 != (int *)0x0) && ((piVar1[6] & 7U) < 7)) &&
            ((100U >> (piVar1[6] & 7U) & 1) != 0)) && (piVar1[8] != p->nTravIds)) {
          pAVar2 = p->pObjCopies[lVar10];
          if ((-1 < p_02->pVarNums[*(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24)]) &&
             (iVar3 = sat_solver_get_var_value
                                (s,p_02->pVarNums
                                   [*(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24)]),
             iVar3 != 0)) {
            iVar8 = p->nTravIds;
            piVar1[8] = iVar8;
            if ((((uint)*(undefined8 *)(piVar1 + 6) & 7) == 2) && (p->nTruePis <= *piVar1)) {
              if (*piVar1 < p->nTruePis) {
                __assert_fail("Saig_ObjIsLo(p, pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                              ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
              }
              uVar7 = (*piVar1 - p->nTruePis) + p->nTruePos;
              if (((int)uVar7 < 0) || (p->vCos->nSize <= (int)uVar7)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              *(int *)((*(ulong *)((long)p->vCos->pArray[uVar7] + 8) & 0xfffffffffffffffe) + 0x20) =
                   iVar8;
            }
            Vec_VecPush(p_00,0,(void *)((ulong)((uint)pAVar2 & 1) ^ (ulong)piVar1 ^
                                       (ulong)(iVar3 == 1)));
          }
        }
        lVar10 = lVar10 + 1;
        pVVar5 = p->vObjs;
        uVar6 = (ulong)pVVar5->nSize;
      } while (lVar10 < (long)uVar6);
    }
    sat_solver_delete(s);
  }
  Aig_ManStop(p_01);
  Cnf_DataFree(p_02);
  iVar3 = (int)uVar6;
  if (fVerbose != 0) {
    iVar8 = p_00->nSize;
    uVar9 = (ulong)iVar8;
    if ((long)uVar9 < 1) {
      uVar11 = 0;
    }
    else {
      uVar6 = 0;
      uVar11 = 0;
      do {
        uVar11 = (ulong)(uint)((int)uVar11 + *(int *)((long)p_00->pArray[uVar6] + 4));
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
    printf("Found %3d candidates.\n",uVar11);
    iVar3 = (int)uVar6;
    if (0 < iVar8) {
      ppvVar4 = p_00->pArray;
      uVar11 = 0;
      do {
        printf("Level %d. Cands  =%d    ",uVar11 & 0xffffffff,
               (ulong)*(uint *)((long)ppvVar4[uVar11] + 4));
        putchar(10);
        iVar3 = (int)uVar6;
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
  }
  if (p->pObjCopies != (Aig_Obj_t **)0x0) {
    free(p->pObjCopies);
    p->pObjCopies = (Aig_Obj_t **)0x0;
  }
  Saig_ManFilterUsingInd2(p,p_00,nConfs,iVar3,fVerbose);
  iVar3 = p_00->nSize;
  uVar6 = (ulong)iVar3;
  if (0 < (long)uVar6) {
    uVar9 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + *(int *)((long)p_00->pArray[uVar9] + 4);
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
    if (iVar8 != 0) {
      if (iVar3 < 1) {
        uVar9 = 0;
      }
      else {
        uVar11 = 0;
        uVar9 = 0;
        do {
          uVar9 = (ulong)(uint)((int)uVar9 + *(int *)((long)p_00->pArray[uVar11] + 4));
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
      }
      printf("Found %3d constraints after filtering.\n",uVar9);
    }
  }
  if ((fVerbose != 0) && (0 < iVar3)) {
    ppvVar4 = p_00->pArray;
    uVar9 = 0;
    do {
      printf("Level %d. Constr =%d    ",uVar9 & 0xffffffff,
             (ulong)*(uint *)((long)ppvVar4[uVar9] + 4));
      putchar(10);
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
  }
  return p_00;
}

Assistant:

Vec_Vec_t * Ssw_ManFindDirectImplications2( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fVerbose )
{
  Vec_Vec_t * vCands = NULL;
  Vec_Ptr_t * vNodes;
  Cnf_Dat_t * pCnf;
  sat_solver * pSat;
  Aig_Man_t * pFrames;
  Aig_Obj_t * pObj, * pRepr, * pReprR;
  int i, f, k, value;
  assert(nFrames == 1);
  vCands = Vec_VecAlloc( nFrames );
  assert(nFrames == 1);
  // perform unrolling
  pFrames = Saig_ManUnrollCOI( p, nFrames );
  assert( Aig_ManCoNum(pFrames) == 1 );
  // start the SAT solver
  pCnf = Cnf_DeriveSimple( pFrames, 0 );
  pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
  if ( pSat != NULL )
    {
      Aig_ManIncrementTravId( p );
      for ( f = 0; f < nFrames; f++ )
        {
          Aig_ManForEachObj( p, pObj, i )
            {
              if ( !Aig_ObjIsCand(pObj) )
                continue;
              //--jlong : also use internal nodes as well
              /* if ( !Aig_ObjIsCi(pObj) ) */
              /*   continue; */ 
              if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                continue;
              // get the node from timeframes
              pRepr  = p->pObjCopies[nFrames*i + nFrames-1-f];
              pReprR = Aig_Regular(pRepr);
              if ( pCnf->pVarNums[Aig_ObjId(pReprR)] < 0 )
                continue;
              //                value = pSat->assigns[ pCnf->pVarNums[Aig_ObjId(pReprR)] ];
              value = sat_solver_get_var_value( pSat, pCnf->pVarNums[Aig_ObjId(pReprR)] );
              if ( value == l_Undef )
                continue;
              // label this node as taken
              Aig_ObjSetTravIdCurrent(p, pObj);
              if ( Saig_ObjIsLo(p, pObj) )
                Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin0(Saig_ObjLoToLi(p, pObj)) );
              // remember the node
              Vec_VecPush( vCands, f, Aig_NotCond( pObj, (value == l_True) ^ Aig_IsComplement(pRepr) ) );
              //        printf( "%s%d ", (value == l_False)? "":"!", i );
            }
        }
      //    printf( "\n" );
      sat_solver_delete( pSat );
    }
  Aig_ManStop( pFrames );
  Cnf_DataFree( pCnf );

  if ( fVerbose )
    {
      printf( "Found %3d candidates.\n", Vec_VecSizeSize(vCands) );
      Vec_VecForEachLevel( vCands, vNodes, k )
        {
          printf( "Level %d. Cands  =%d    ", k, Vec_PtrSize(vNodes) );
          //            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
          //                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
          printf( "\n" );
        }
    }

  ABC_FREE( p->pObjCopies );
  /* -- jlong -- this does the SAT proof of the constraints */
  Saig_ManFilterUsingInd2( p, vCands, nConfs, nProps, fVerbose );
  if ( Vec_VecSizeSize(vCands) )
    printf( "Found %3d constraints after filtering.\n", Vec_VecSizeSize(vCands) );
  if ( fVerbose )
    {
      Vec_VecForEachLevel( vCands, vNodes, k )
        {
          printf( "Level %d. Constr =%d    ", k, Vec_PtrSize(vNodes) );
          //            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
          //                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
          printf( "\n" );
        }
    }
  
  return vCands;
}